

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_close(AMQP_VALUE value,CLOSE_HANDLE *close_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  ERROR_HANDLE local_48;
  ERROR_HANDLE error;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  CLOSE_INSTANCE *close_instance;
  CLOSE_HANDLE *ppCStack_18;
  int result;
  CLOSE_HANDLE *close_handle_local;
  AMQP_VALUE value_local;
  
  ppCStack_18 = close_handle;
  close_handle_local = (CLOSE_HANDLE *)value;
  list_value = (AMQP_VALUE)close_create_internal();
  *ppCStack_18 = (CLOSE_HANDLE)list_value;
  if (*ppCStack_18 == (CLOSE_HANDLE)0x0) {
    close_instance._4_4_ = 0x26e8;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)close_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      close_destroy(*ppCStack_18);
      close_instance._4_4_ = 0x26f0;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if ((item_value._4_4_ != 0) &&
           (error = (ERROR_HANDLE)amqpvalue_get_list_item(pAStack_30,0),
           (AMQP_VALUE)error != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)error);
          if (AVar2 != AMQP_TYPE_NULL) {
            iVar1 = amqpvalue_get_error((AMQP_VALUE)error,&local_48);
            if (iVar1 != 0) {
              amqpvalue_destroy((AMQP_VALUE)error);
              close_destroy(*ppCStack_18);
              return 0x2713;
            }
            error_destroy(local_48);
          }
          amqpvalue_destroy((AMQP_VALUE)error);
        }
        pAVar3 = amqpvalue_clone((AMQP_VALUE)close_handle_local);
        *(AMQP_VALUE *)list_value = pAVar3;
        close_instance._4_4_ = 0;
      }
      else {
        close_instance._4_4_ = 0x26f7;
      }
    }
  }
  return close_instance._4_4_;
}

Assistant:

int amqpvalue_get_close(AMQP_VALUE value, CLOSE_HANDLE* close_handle)
{
    int result;
    CLOSE_INSTANCE* close_instance = (CLOSE_INSTANCE*)close_create_internal();
    *close_handle = close_instance;
    if (*close_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            close_destroy(*close_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* error */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                ERROR_HANDLE error;
                                if (amqpvalue_get_error(item_value, &error) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    close_destroy(*close_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                                else
                                {
                                    error_destroy(error);
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    close_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}